

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRBuilder.cpp
# Opt level: O2

void __thiscall
IRBuilder::BuildArg(IRBuilder *this,OpCode newOpcode,uint32 offset,ArgSlot argument,
                   RegSlot srcRegSlot)

{
  IRType type;
  code *pcVar1;
  OpCode opcode;
  bool bVar2;
  undefined4 *puVar3;
  StackSym *sym;
  SymOpnd *dstOpnd;
  RegOpnd *src1Opnd;
  Instr *local_40;
  Instr *instr;
  
  instr._4_4_ = offset;
  bVar2 = OpCodeAttr::HasMultiSizeLayout(newOpcode);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilder.cpp"
                       ,0x17ba,"(OpCodeAttr::HasMultiSizeLayout(newOpcode))",
                       "OpCodeAttr::HasMultiSizeLayout(newOpcode)");
    if (!bVar2) goto LAB_00498b73;
    *puVar3 = 0;
  }
  this->m_argsOnStack = this->m_argsOnStack + 1;
  if (argument == 0xffff) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilder.cpp"
                       ,0x17c6,"(argument < 0xffff)","argument < USHRT_MAX");
    if (!bVar2) goto LAB_00498b73;
    *puVar3 = 0;
  }
  sym = SymTable::GetArgSlotSym(this->m_func->m_symTable,argument + 1);
  if ((argument != 0xffff) && (sym != (StackSym *)0x0)) {
    opcode = ArgOut_A;
    if (newOpcode != ArgOut_ANonVar) {
      opcode = newOpcode;
    }
    type = TyVar;
    if (newOpcode == ArgOut_ANonVar) {
      type = TyUint64;
    }
    dstOpnd = IR::SymOpnd::New(&sym->super_Sym,type,this->m_func);
    src1Opnd = BuildSrcOpnd(this,srcRegSlot,type);
    local_40 = IR::Instr::New(opcode,&dstOpnd->super_Opnd,&src1Opnd->super_Opnd,this->m_func);
    AddInstr(this,local_40,instr._4_4_);
    SList<IR::Instr_*,_Memory::ArenaAllocator,_RealCount>::Prepend(this->m_argStack,&local_40);
    return;
  }
  AssertCount = AssertCount + 1;
  Js::Throw::LogAssert();
  puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
  *puVar3 = 1;
  bVar2 = Js::Throw::ReportAssert
                    ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilder.cpp"
                     ,0x17ca,"((0))","Arg count too big...");
  if (bVar2) {
    *puVar3 = 0;
    Js::Throw::FatalInternalError(-0x7fffbffb);
  }
LAB_00498b73:
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

void
IRBuilder::BuildArg(Js::OpCode newOpcode, uint32 offset, Js::ArgSlot argument, Js::RegSlot srcRegSlot)
{
    Assert(OpCodeAttr::HasMultiSizeLayout(newOpcode));

    IR::Instr *     instr;
    IRType type = TyVar;
    if (newOpcode == Js::OpCode::ArgOut_ANonVar)
    {
        newOpcode = Js::OpCode::ArgOut_A;
        type = TyMachPtr;
    }
    m_argsOnStack++;
    StackSym *      symDst;

    Assert(argument < USHRT_MAX);
    symDst = m_func->m_symTable->GetArgSlotSym((uint16)(argument+1));
    if (symDst == nullptr || (uint16)(argument + 1) != (argument + 1))
    {
        AssertMsg(UNREACHED, "Arg count too big...");
        Fatal();
    }

    IR::SymOpnd * dstOpnd = IR::SymOpnd::New(symDst, type, m_func);
    IR::RegOpnd *  src1Opnd = this->BuildSrcOpnd(srcRegSlot, type);
    instr = IR::Instr::New(newOpcode, dstOpnd, src1Opnd, m_func);

    this->AddInstr(instr, offset);

    m_argStack->Push(instr);
}